

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O1

void __thiscall
mp::BasicExprVisitor<MockBinaryFuncVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
          (BasicExprVisitor<MockBinaryFuncVisitor,_TestResult,_mp::internal::ExprTypes> *this,Expr e
          )

{
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  gmock_a1;
  ExprBase e_00;
  AssertionFailure *this_00;
  
  switch(*(undefined4 *)e.super_ExprBase.impl_) {
  case 1:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::NumericConstant>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 2:
  case 3:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::Reference>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
    gmock_a1 = internal::ExprTypes::
               UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
                         ((Expr)e.super_ExprBase.impl_);
    MockBinaryFuncVisitor::VisitBinaryFunc
              ((MockBinaryFuncVisitor *)this,
               (Argument1)
               gmock_a1.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_
              );
    return;
  case 0x27:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x28:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::PLTerm>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x29:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::CallExpr>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x2e:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x2f:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x30:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::LogicalConstant>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x31:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x32:
  case 0x33:
  case 0x34:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x41:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x42:
  case 0x43:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x44:
  case 0x45:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x46:
    e_00.impl_ = (Impl *)internal::ExprTypes::UncheckedCast<mp::StringLiteral>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  case 0x47:
    e_00.impl_ = (Impl *)internal::ExprTypes::
                         UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
                                   ((Expr)e.super_ExprBase.impl_);
    break;
  default:
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid expression");
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  VisitUnsupported(this,(Expr)e_00.impl_);
  return;
}

Assistant:

Result VisitNumericConstant(NumericConstant c) {
    return MP_DISPATCH(VisitNumeric(c));
  }